

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O0

Aig_Man_t * Abc_NtkAigForConstraints(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  Aig_Man_t *pCare;
  int iVar1;
  void *pvVar2;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_60;
  int iOut;
  int k;
  int i;
  Vec_Int_t *vOuts;
  Aig_Obj_t *pObjRoot;
  Aig_Obj_t *pObjAig;
  Aig_Obj_t *pPo;
  Aig_Obj_t *pPi;
  Aig_Man_t *pMan;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  if (p->pCare == (Aig_Man_t *)0x0) {
    p_local = (Mfs_Man_t *)0x0;
  }
  else {
    p_local = (Mfs_Man_t *)Aig_ManStart(1000);
    Aig_ManIncrementTravId(p->pCare);
    for (iOut = 0; iVar1 = Vec_PtrSize(p->vSupp), iOut < iVar1; iOut = iOut + 1) {
      pvVar2 = Vec_PtrEntry(p->vSupp,iOut);
      pAVar3 = Aig_ManCi(p->pCare,(int)*(undefined8 *)((long)pvVar2 + 0x38));
      Aig_ObjSetTravIdCurrent(p->pCare,pAVar3);
      pAVar4 = Aig_ObjCreateCi((Aig_Man_t *)p_local);
      (pAVar3->field_5).pData = pAVar4;
    }
    vOuts = (Vec_Int_t *)Aig_ManConst1((Aig_Man_t *)p_local);
    for (iOut = 0; iVar1 = Vec_PtrSize(p->vSupp), iOut < iVar1; iOut = iOut + 1) {
      pvVar2 = Vec_PtrEntry(p->vSupp,iOut);
      p_00 = (Vec_Int_t *)Vec_PtrEntry(p->vSuppsInv,(int)*(undefined8 *)((long)pvVar2 + 0x38));
      for (local_60 = 0; iVar1 = Vec_IntSize(p_00), local_60 < iVar1; local_60 = local_60 + 1) {
        iVar1 = Vec_IntEntry(p_00,local_60);
        pAVar3 = Aig_ManCo(p->pCare,iVar1);
        iVar1 = Aig_ObjIsTravIdCurrent(p->pCare,pAVar3);
        if (iVar1 == 0) {
          Aig_ObjSetTravIdCurrent(p->pCare,pAVar3);
          pAVar4 = Aig_ObjFanin0(pAVar3);
          pAVar5 = Aig_ManConst1(p->pCare);
          if (pAVar4 != pAVar5) {
            pCare = p->pCare;
            pAVar4 = Aig_ObjFanin0(pAVar3);
            pAVar4 = Abc_NtkConstructCare_rec(pCare,pAVar4,(Aig_Man_t *)p_local);
            if (pAVar4 != (Aig_Obj_t *)0x0) {
              iVar1 = Aig_ObjFaninC0(pAVar3);
              pAVar3 = Aig_NotCond(pAVar4,iVar1);
              vOuts = (Vec_Int_t *)Aig_And((Aig_Man_t *)p_local,(Aig_Obj_t *)vOuts,pAVar3);
            }
          }
        }
      }
    }
    Aig_ObjCreateCo((Aig_Man_t *)p_local,(Aig_Obj_t *)vOuts);
    Aig_ManCleanup((Aig_Man_t *)p_local);
  }
  return (Aig_Man_t *)p_local;
}

Assistant:

Aig_Man_t * Abc_NtkAigForConstraints( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    Aig_Man_t * pMan;
    Aig_Obj_t * pPi, * pPo, * pObjAig, * pObjRoot;
    Vec_Int_t * vOuts;
    int i, k, iOut;
    if ( p->pCare == NULL )
        return NULL;
    pMan = Aig_ManStart( 1000 );
    // mark the care set
    Aig_ManIncrementTravId( p->pCare );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pFanin, i )
    {
        pPi = Aig_ManCi( p->pCare, (int)(ABC_PTRUINT_T)pFanin->pData );
        Aig_ObjSetTravIdCurrent( p->pCare, pPi );
        pPi->pData = Aig_ObjCreateCi(pMan);
    }
    // construct the constraints
    pObjRoot = Aig_ManConst1(pMan);
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pFanin, i )
    {
        vOuts = (Vec_Int_t *)Vec_PtrEntry( p->vSuppsInv, (int)(ABC_PTRUINT_T)pFanin->pData );
        Vec_IntForEachEntry( vOuts, iOut, k )
        {
            pPo = Aig_ManCo( p->pCare, iOut );
            if ( Aig_ObjIsTravIdCurrent( p->pCare, pPo ) )
                continue;
            Aig_ObjSetTravIdCurrent( p->pCare, pPo );
            if ( Aig_ObjFanin0(pPo) == Aig_ManConst1(p->pCare) )
                continue;
            pObjAig = Abc_NtkConstructCare_rec( p->pCare, Aig_ObjFanin0(pPo), pMan );
            if ( pObjAig == NULL )
                continue;
            pObjAig = Aig_NotCond( pObjAig, Aig_ObjFaninC0(pPo) );
            pObjRoot = Aig_And( pMan, pObjRoot, pObjAig );
        }
    }
    Aig_ObjCreateCo( pMan, pObjRoot );
    Aig_ManCleanup( pMan );
    return pMan;
}